

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmdblookup.c
# Opt level: O3

MMDB_lookup_result_s *
lookup_or_die(MMDB_lookup_result_s *__return_storage_ptr__,MMDB_s *mmdb,char *ipstr)

{
  uint uVar1;
  int iVar2;
  ulong in_RAX;
  MMDB_lookup_result_s *pMVar3;
  undefined4 extraout_var;
  char *__s;
  int mmdb_error;
  int gai_error;
  undefined8 local_18;
  
  local_18 = in_RAX;
  pMVar3 = MMDB_lookup_string(__return_storage_ptr__,mmdb,ipstr,(int *)((long)&local_18 + 4),
                              (int *)&local_18);
  __s = (char *)(ulong)local_18._4_4_;
  if (local_18._4_4_ == 0) {
    __s = (char *)(local_18 & 0xffffffff);
    if ((int)local_18 == 0) {
      return pMVar3;
    }
  }
  else {
    lookup_or_die_cold_1();
  }
  lookup_or_die_cold_2();
  uVar1 = rand();
  iVar2 = snprintf(__s,0x10,"%u.%u.%u.%u",(ulong)(uVar1 & 0xff),(ulong)(uVar1 >> 8 & 0xff),
                   (ulong)(uVar1 >> 0x10 & 0xff),uVar1 >> 0x18);
  return (MMDB_lookup_result_s *)CONCAT44(extraout_var,iVar2);
}

Assistant:

static MMDB_lookup_result_s lookup_or_die(MMDB_s *mmdb, const char *ipstr) {
    int gai_error, mmdb_error;
    MMDB_lookup_result_s result =
        MMDB_lookup_string(mmdb, ipstr, &gai_error, &mmdb_error);

    if (0 != gai_error) {
#ifdef _WIN32
        char const *const strerr = gai_strerrorA(gai_error);
#else
        char const *const strerr = gai_strerror(gai_error);
#endif
        fprintf(stderr,
                "\n  Error from call to getaddrinfo for %s - %s\n\n",
                ipstr,
                strerr);
        exit(3);
    }

    if (MMDB_SUCCESS != mmdb_error) {
        fprintf(stderr,
                "\n  Got an error from the maxminddb library: %s\n\n",
                MMDB_strerror(mmdb_error));
        exit(4);
    }

    return result;
}